

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unreferenced_variadic.cpp
# Opt level: O0

int main(void)

{
  vector<int,_std::allocator<int>_> local_50;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> local_20;
  
  add_values<>(&local_20,4);
  std::vector<int,_std::allocator<int>_>::~vector(&local_20);
  add_values<int>(&local_38,4,1);
  std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  add_values<int,int>(&local_50,4,1,2);
  std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  return 0;
}

Assistant:

int main()
{
  // expected: no warnings or errors in this code
  add_values(4);
  add_values(4, 1);
  add_values(4, 1, 2);
}